

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic-sensor.cpp
# Opt level: O0

Vector __thiscall
stateObservation::AlgebraicSensor::getMeasurements(AlgebraicSensor *this,bool noisy)

{
  byte in_DL;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar1;
  undefined7 in_register_00000031;
  double *pdVar2;
  Vector VVar3;
  Matrix<double,__1,_1,_0,__1,_1> local_80 [2];
  Matrix<double,__1,_1,_0,__1,_1> local_60;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_50;
  undefined1 local_30 [31];
  bool noisy_local;
  AlgebraicSensor *this_local;
  
  pdVar2 = (double *)CONCAT71(in_register_00000031,noisy);
  local_30[0x17] = in_DL & 1;
  unique0x10000225 = pdVar2;
  this_local = this;
  if ((local_30[0x17] == 0) || (pdVar2[1] == 0.0)) {
    if (((ulong)pdVar2[10] & 1) == 0) {
      if (*(int *)((long)pdVar2 + 0x14) == 0) {
        (**(code **)((long)*pdVar2 + 0x68))(local_80);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)(pdVar2 + 0xb),local_80);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_80);
      }
      else {
        (**(code **)((long)*pdVar2 + 0x68))();
        Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator<<
                  (&local_50,(DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)(pdVar2 + 0xb),
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_60);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_50,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(pdVar2 + 5));
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                  (&local_50);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_60);
      }
      *(undefined1 *)(pdVar2 + 10) = 1;
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)this,
               (Matrix<double,__1,_1,_0,__1,_1> *)(pdVar2 + 0xb));
    IVar1 = extraout_RDX_00;
  }
  else {
    if (((ulong)pdVar2[7] & 1) == 0) {
      computeNoisyMeasurement_((AlgebraicSensor *)local_30);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)(pdVar2 + 8),
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_30);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
      *(undefined1 *)(pdVar2 + 7) = 1;
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)this,
               (Matrix<double,__1,_1,_0,__1,_1> *)(pdVar2 + 8));
    IVar1 = extraout_RDX;
  }
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar1;
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector AlgebraicSensor::getMeasurements(bool noisy)
    {
        if (noisy && noise_!=0x0)
        {
            if (!storedNoisyMeasurement_)
            {
                noisyMeasurement_ =  computeNoisyMeasurement_();
                storedNoisyMeasurement_=true;
            }
            return noisyMeasurement_;
        }
        else
        {
            if (!storedNoiselessMeasurement_)
            {
                if (concat_>0)
                  noiselessMeasurement_<< computeNoiselessMeasurement_() ,directInputToOutput_;
                else
                  noiselessMeasurement_= computeNoiselessMeasurement_();

                storedNoiselessMeasurement_=true;
            }
            return noiselessMeasurement_;
        }
    }